

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataStructWithinCollectionGather
               (TupleDataLayout *layout,Vector *heap_locations,idx_t list_size_before,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> list_vector,
               vector<duckdb::TupleDataGatherFunction,_true> *child_functions)

{
  unsigned_long *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TupleDataLayout *pTVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type pVVar10;
  const_reference pvVar11;
  size_type __n;
  idx_t child_i;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  TupleDataLayout *local_88;
  Vector *local_80;
  ulong local_78;
  data_ptr_t local_70;
  data_ptr_t local_68;
  Vector *local_60;
  idx_t local_58;
  SelectionVector *local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  optional_ptr<duckdb::Vector,_true> list_vector_local;
  idx_t local_38;
  
  list_vector_local = list_vector;
  local_88 = layout;
  local_50 = scan_sel;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&list_vector_local);
  local_68 = (list_vector_local.ptr)->data;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&list_vector_local);
  local_60 = list_vector_local.ptr;
  FlatVector::VerifyFlatVector(list_vector_local.ptr);
  local_70 = heap_locations->data;
  FlatVector::VerifyFlatVector(target);
  local_58 = list_size_before;
  if (scan_count != 0) {
    local_48 = &(target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar14 = 0;
    local_80 = heap_locations;
    local_78 = scan_count;
    do {
      uVar12 = uVar14;
      if (target_sel->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)target_sel->sel_vector[uVar14];
      }
      puVar1 = (local_60->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)) {
        uVar9 = *(ulong *)(local_68 + uVar12 * 0x10 + 8);
        if (uVar9 != 0) {
          puVar13 = (ulong *)(local_68 + uVar12 * 0x10 + 8);
          lVar2 = *(long *)(local_70 + uVar14 * 8);
          *(ulong *)(local_70 + uVar14 * 8) = (uVar9 + 7 >> 3) + lVar2;
          uVar12 = 0;
          do {
            if ((*(byte *)(lVar2 + (uVar12 >> 3)) >> ((uint)uVar12 & 7) & 1) == 0) {
              _Var8._M_head_impl =
                   (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var8._M_head_impl == (unsigned_long *)0x0) {
                local_38 = (target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,&local_38);
                p_Var5 = p_Stack_90;
                peVar4 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                this = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar4;
                (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var5;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                }
                pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_48);
                _Var8._M_head_impl =
                     (pTVar7->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var8._M_head_impl;
              }
              bVar3 = (byte)(list_size_before + uVar12) & 0x3f;
              _Var8._M_head_impl[list_size_before + uVar12 >> 6] =
                   _Var8._M_head_impl[list_size_before + uVar12 >> 6] &
                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
              uVar9 = *puVar13;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar9);
          list_size_before = list_size_before + uVar9;
          scan_count = local_78;
          heap_locations = local_80;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != scan_count);
  }
  this_00 = StructVector::GetEntries(target);
  pTVar6 = local_88;
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_00,__n);
      pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_01);
      pvVar11 = vector<duckdb::TupleDataGatherFunction,_true>::operator[](child_functions,__n);
      (*pvVar11->function)
                (pTVar6,heap_locations,local_58,local_50,scan_count,pVVar10,target_sel,
                 (optional_ptr<duckdb::Vector,_true>)list_vector_local.ptr,&pvVar11->child_functions
                );
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void TupleDataStructWithinCollectionGather(const TupleDataLayout &layout, Vector &heap_locations,
                                                  const idx_t list_size_before, const SelectionVector &scan_sel,
                                                  const idx_t scan_count, Vector &target,
                                                  const SelectionVector &target_sel, optional_ptr<Vector> list_vector,
                                                  const vector<TupleDataGatherFunction> &child_functions) {
	// List parent
	const auto list_entries = FlatVector::GetData<list_entry_t>(*list_vector);
	const auto &list_validity = FlatVector::Validity(*list_vector);

	// Source
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Target
	auto &target_validity = FlatVector::Validity(target);

	uint64_t target_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto target_idx = target_sel.get_index(i);
		if (!list_validity.RowIsValid(target_idx)) {
			continue;
		}

		const auto &list_length = list_entries[target_idx].length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip over it
		auto &source_heap_location = source_heap_locations[i];
		ValidityBytes source_mask(source_heap_location, list_length);
		source_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Load the child validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			if (!source_mask.RowIsValidUnsafe(child_i)) {
				target_validity.SetInvalid(target_offset + child_i);
			}
		}
		target_offset += list_length;
	}

	// Recurse
	auto &struct_targets = StructVector::GetEntries(target);
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_targets.size(); struct_col_idx++) {
		auto &struct_target = *struct_targets[struct_col_idx];
		const auto &struct_gather_function = child_functions[struct_col_idx];
		struct_gather_function.function(layout, heap_locations, list_size_before, scan_sel, scan_count, struct_target,
		                                target_sel, list_vector, struct_gather_function.child_functions);
	}
}